

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O1

void handle_pp_include(Context_conflict1 *ctx)

{
  char cVar1;
  IncludeState *s;
  MOJOSHADER_includeOpen p_Var2;
  char *pcVar3;
  MOJOSHADER_malloc p_Var4;
  MOJOSHADER_includeClose p_Var5;
  MOJOSHADER_free p_Var6;
  void *pvVar7;
  long lVar8;
  Token TVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  MOJOSHADER_includeType unaff_R15D;
  bool bVar15;
  undefined8 uStack_50;
  char acStack_48 [8];
  char *local_40;
  char *newdata;
  uint newbytes;
  
  pcVar12 = acStack_48;
  s = ctx->include_stack;
  if (s->pushedback == 0) {
    uStack_50 = 0x14b836;
    TVar9 = preprocessor_lexer(s);
  }
  else {
    s->pushedback = 0;
    TVar9 = s->tokenval;
  }
  if (TVar9 == TOKEN_STRING_LITERAL) {
    unaff_R15D = MOJOSHADER_INCLUDETYPE_LOCAL;
    bVar15 = true;
  }
  else if (TVar9 == 0x3c) {
    uVar10 = s->bytes_left;
    do {
      bVar15 = uVar10 == 0;
      if (!bVar15) {
        cVar1 = *s->source;
        bVar15 = cVar1 == '\r' || cVar1 == '\n';
        if ((cVar1 != '\n') && (cVar1 != '\r')) {
          s->source = s->source + 1;
          uVar10 = uVar10 - 1;
          s->bytes_left = uVar10;
          if (cVar1 == '>') break;
        }
      }
    } while (!bVar15);
    bVar15 = !bVar15;
    unaff_R15D = MOJOSHADER_INCLUDETYPE_SYSTEM;
  }
  else {
    bVar15 = false;
  }
  if (bVar15) {
    pcVar13 = s->token + 1;
    s->token = pcVar13;
    uVar14 = (long)s->source - (long)pcVar13;
    lVar8 = -((uVar14 & 0xffffffff) + 0xf & 0xfffffffffffffff0);
    pcVar12 = acStack_48 + lVar8;
    uVar14 = (ulong)((int)uVar14 - 1);
    *(undefined8 *)((long)&uStack_50 + lVar8) = 0x14b8dc;
    memcpy(pcVar12,pcVar13,uVar14);
    pcVar12[uVar14] = '\0';
    *(undefined8 *)((long)&uStack_50 + lVar8) = 0x14b8ea;
    iVar11 = require_newline(s);
    bVar15 = iVar11 != 0;
    pcVar13 = pcVar12;
  }
  else {
    bVar15 = false;
    pcVar13 = (char *)0x0;
  }
  if (bVar15) {
    local_40 = (char *)0x0;
    newdata._4_4_ = 0;
    p_Var2 = ctx->open_callback;
    if ((p_Var2 != (MOJOSHADER_includeOpen)0x0) &&
       (ctx->close_callback != (MOJOSHADER_includeClose)0x0)) {
      pcVar3 = s->source_base;
      p_Var4 = ctx->malloc;
      pvVar7 = ctx->malloc_data;
      *(MOJOSHADER_free *)(pcVar12 + -0x10) = ctx->free;
      *(void **)(pcVar12 + -8) = pvVar7;
      pcVar12[-0x18] = 'U';
      pcVar12[-0x17] = -0x47;
      pcVar12[-0x16] = '\x14';
      pcVar12[-0x15] = '\0';
      pcVar12[-0x14] = '\0';
      pcVar12[-0x13] = '\0';
      pcVar12[-0x12] = '\0';
      pcVar12[-0x11] = '\0';
      iVar11 = (*p_Var2)(unaff_R15D,pcVar13,pcVar3,&local_40,(uint *)((long)&newdata + 4),p_Var4,
                         *(MOJOSHADER_free *)(pcVar12 + -0x10),*(void **)(pcVar12 + -8));
      uVar10 = newdata._4_4_;
      pcVar3 = local_40;
      if (iVar11 == 0) {
        pcVar12[-8] = -7;
        pcVar12[-7] = -0x47;
        pcVar12[-6] = '\x14';
        pcVar12[-5] = '\0';
        pcVar12[-4] = '\0';
        pcVar12[-3] = '\0';
        pcVar12[-2] = '\0';
        pcVar12[-1] = '\0';
        failf(ctx,"%s","Include callback failed");
      }
      else {
        p_Var5 = ctx->close_callback;
        pcVar12[-8] = -0x80;
        pcVar12[-7] = -0x47;
        pcVar12[-6] = '\x14';
        pcVar12[-5] = '\0';
        pcVar12[-4] = '\0';
        pcVar12[-3] = '\0';
        pcVar12[-2] = '\0';
        pcVar12[-1] = '\0';
        iVar11 = push_source(ctx,pcVar13,pcVar3,uVar10,1,p_Var5);
        pcVar13 = local_40;
        if (iVar11 == 0) {
          if (ctx->out_of_memory == 0) {
            *(code **)(pcVar12 + -8) = handle_pp_line;
            __assert_fail("ctx->out_of_memory",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                          ,0x33e,"void handle_pp_include(Context *)");
          }
          p_Var4 = ctx->malloc;
          p_Var6 = ctx->free;
          pvVar7 = ctx->malloc_data;
          p_Var5 = ctx->close_callback;
          pcVar12[-8] = -0x57;
          pcVar12[-7] = -0x47;
          pcVar12[-6] = '\x14';
          pcVar12[-5] = '\0';
          pcVar12[-4] = '\0';
          pcVar12[-3] = '\0';
          pcVar12[-2] = '\0';
          pcVar12[-1] = '\0';
          (*p_Var5)(pcVar13,p_Var4,p_Var6,pvVar7);
        }
      }
      return;
    }
    pcVar12 = "Saw #include, but no include callbacks defined";
  }
  else {
    pcVar12 = "Invalid #include directive";
  }
  failf(ctx,"%s",pcVar12);
  return;
}

Assistant:

static void handle_pp_include(Context *ctx)
{
    IncludeState *state = ctx->include_stack;
    Token token = lexer(state);
    MOJOSHADER_includeType incltype;
    char *filename = NULL;
    int bogus = 0;

    if (token == TOKEN_STRING_LITERAL)
        incltype = MOJOSHADER_INCLUDETYPE_LOCAL;
    else if (token == ((Token) '<'))
    {
        incltype = MOJOSHADER_INCLUDETYPE_SYSTEM;
        // can't use lexer, since every byte between the < > pair is
        //  considered part of the filename.  :/
        while (!bogus)
        {
            if ( !(bogus = (state->bytes_left == 0)) )
            {
                const char ch = *state->source;
                if ( !(bogus = ((ch == '\r') || (ch == '\n'))) )
                {
                    state->source++;
                    state->bytes_left--;

                    if (ch == '>')
                        break;
                } // if
            } // if
        } // while
    } // else if
    else
    {
        bogus = 1;
    } // else

    if (!bogus)
    {
        state->token++;  // skip '<' or '\"'...
        const unsigned int len = ((unsigned int) (state->source-state->token));
        filename = (char *) alloca(len);
        memcpy(filename, state->token, len-1);
        filename[len-1] = '\0';
        bogus = !require_newline(state);
    } // if

    if (bogus)
    {
        fail(ctx, "Invalid #include directive");
        return;
    } // else

    const char *newdata = NULL;
    unsigned int newbytes = 0;
    if ((ctx->open_callback == NULL) || (ctx->close_callback == NULL))
    {
        fail(ctx, "Saw #include, but no include callbacks defined");
        return;
    } // if

    if (!ctx->open_callback(incltype, filename, state->source_base,
                            &newdata, &newbytes, ctx->malloc,
                            ctx->free, ctx->malloc_data))
    {
        fail(ctx, "Include callback failed");  // !!! FIXME: better error
        return;
    } // if

    MOJOSHADER_includeClose callback = ctx->close_callback;
    if (!push_source(ctx, filename, newdata, newbytes, 1, callback))
    {
        assert(ctx->out_of_memory);
        ctx->close_callback(newdata, ctx->malloc, ctx->free, ctx->malloc_data);
    } // if
}